

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateManager.cpp
# Opt level: O1

Endpoint * __thiscall
helics::MessageFederateManager::getDataSink(MessageFederateManager *this,string_view name)

{
  bool bVar1;
  int iVar2;
  string *this_00;
  Endpoint **ppEVar3;
  long lVar4;
  pthread_rwlock_t *__rwlock;
  Endpoint **ppEVar5;
  BlockIterator<const_helics::Endpoint,_32,_const_helics::Endpoint_*const_*> ept;
  BlockIterator<const_helics::Endpoint,_32,_const_helics::Endpoint_*const_*> local_40;
  
  bVar1 = (this->mLocalEndpoints).enabled;
  if (bVar1 == true) {
    __rwlock = (pthread_rwlock_t *)&(this->mLocalEndpoints).m_mutex;
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&__rwlock->__data);
  }
  else {
    __rwlock = (pthread_rwlock_t *)0x0;
  }
  gmlc::containers::
  DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>::find
            (&local_40,
             (DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>
              *)this,name);
  iVar2 = (this->mLocalEndpoints).m_obj.dataStorage.bsize;
  ppEVar3 = (this->mLocalEndpoints).m_obj.dataStorage.dataptr;
  lVar4 = (long)(this->mLocalEndpoints).m_obj.dataStorage.dataSlotIndex;
  if (ppEVar3 == (Endpoint **)0x0) {
    ppEVar5 = &gmlc::containers::
               StableBlockVector<helics::Endpoint,_5U,_std::allocator<helics::Endpoint>_>::end::
               emptyValue;
  }
  else {
    ppEVar5 = ppEVar3 + lVar4 + 1;
  }
  ppEVar3 = ppEVar3 + lVar4;
  if (iVar2 == 0x20) {
    ppEVar3 = ppEVar5;
    iVar2 = 0;
  }
  if ((local_40.vec == ppEVar3) && (local_40.offset == iVar2)) {
    local_40.ptr = (Endpoint *)invalidEpt;
  }
  else {
    this_00 = Interface::getExtractionType_abi_cxx11_(&(local_40.ptr)->super_Interface);
    iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                    "sink");
    if (iVar2 != 0) {
      local_40.ptr = (Endpoint *)invalidEptNC;
    }
  }
  if (bVar1 != false) {
    pthread_rwlock_unlock(__rwlock);
  }
  return local_40.ptr;
}

Assistant:

const Endpoint& MessageFederateManager::getDataSink(std::string_view name) const
{
    auto sharedEpt = mLocalEndpoints.lock();
    auto ept = sharedEpt->find(name);
    if (ept == sharedEpt.end()) {
        return invalidEpt;
    }
    if (ept->getType() != "sink") {
        return invalidEptNC;
    }
    return *ept;
}